

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum32.c
# Opt level: O0

void Hacl_Bignum32_mod_exp_vartime_precomp
               (Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 *k,uint32_t *a,uint32_t bBits,uint32_t *b
               ,uint32_t *res)

{
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 k1;
  uint32_t uStack_50;
  uint32_t len1;
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 k10;
  uint32_t *res_local;
  uint32_t *b_local;
  uint32_t bBits_local;
  uint32_t *a_local;
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 *k_local;
  
  uStack_50 = (uint32_t)*(undefined8 *)k;
  k1.n._0_4_ = (uint32_t)*(undefined8 *)&k->mu;
  Hacl_Bignum_Exponentiation_bn_mod_exp_vartime_precomp_u32
            (uStack_50,k->n,(uint32_t)k1.n,k->r2,a,bBits,b,res);
  return;
}

Assistant:

void
Hacl_Bignum32_mod_exp_vartime_precomp(
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 *k,
  uint32_t *a,
  uint32_t bBits,
  uint32_t *b,
  uint32_t *res
)
{
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 k10 = *k;
  uint32_t len1 = k10.len;
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 k1 = *k;
  Hacl_Bignum_Exponentiation_bn_mod_exp_vartime_precomp_u32(len1,
    k1.n,
    k1.mu,
    k1.r2,
    a,
    bBits,
    b,
    res);
}